

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

void __thiscall CoreML::ShapeRange::ShapeRange(ShapeRange *this,RangeValue *min,RangeValue *max)

{
  ulong uVar1;
  undefined7 uVar2;
  byte bVar3;
  size_t sVar4;
  runtime_error *prVar5;
  stringstream ss;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  uVar2 = *(undefined7 *)&min->field_0x1;
  sVar4 = min->_val;
  (this->_minimum)._isUnbound = min->_isUnbound;
  *(undefined7 *)&(this->_minimum).field_0x1 = uVar2;
  (this->_minimum)._val = sVar4;
  uVar2 = *(undefined7 *)&max->field_0x1;
  sVar4 = max->_val;
  (this->_maximum)._isUnbound = max->_isUnbound;
  *(undefined7 *)&(this->_maximum).field_0x1 = uVar2;
  (this->_maximum)._val = sVar4;
  if (min->_isUnbound == false) {
    bVar3 = 0;
    if (max->_isUnbound == false) {
      uVar1 = min->_val;
      sVar4 = RangeValue::value(max);
      if (sVar4 < uVar1) goto LAB_00276ddb;
      bVar3 = min->_isUnbound;
    }
    if ((bVar3 & 1) == 0) {
      return;
    }
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"Constructing invalid ShapeRange unbound minimum value.",0x36);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,asStack_1c8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00276ddb:
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Constructing invalid ShapeRange with ",0x25);
  ::operator<<(local_198,min);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,", ",2);
  ::operator<<(local_198,max);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,asStack_1c8);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ShapeRange::ShapeRange(const RangeValue& min, const RangeValue& max)
:
_minimum(min),
_maximum(max)
{
    if (min > max)
    {
        std::stringstream ss;
        ss << "Constructing invalid ShapeRange with " << min << ", " << max;
        throw std::runtime_error(ss.str());
    }
    if (min.isUnbound()) {
        std::stringstream ss;
        ss << "Constructing invalid ShapeRange unbound minimum value.";
        throw std::runtime_error(ss.str());
    }
}